

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

uint RigidBodyDynamics::GetMovableBodyId(Model *model,uint id)

{
  pointer pFVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(id - model->fixed_body_discriminator);
  if ((id != 0xffffffff && model->fixed_body_discriminator <= id) &&
     (pFVar1 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start,
     uVar3 = ((long)(model->mFixedBodies).
                    super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    .
                    super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4) *
             -0x79435e50d79435e5, uVar2 <= uVar3 && uVar3 - uVar2 != 0)) {
    id = pFVar1[uVar2].mMovableParent;
  }
  return id;
}

Assistant:

unsigned int GetMovableBodyId (Model& model, unsigned int id)
{
  if(model.IsFixedBodyId(id)) {
    unsigned int fbody_id = id - model.fixed_body_discriminator;
    return model.mFixedBodies[fbody_id].mMovableParent;
  } else {
    return id;
  }
}